

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

int __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::ClassId
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *in_stack_fffffffffffffb70;
  allocator<char> *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb88;
  TPZDohrSubstructCondense<double> *in_stack_fffffffffffffb90;
  TPZMatrix<double> *in_stack_fffffffffffffba0;
  TPZDohrSubstructCondense<double> *in_stack_fffffffffffffbb0;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  uVar1 = Hash(in_stack_fffffffffffffb70);
  iVar2 = TPZMatrix<double>::ClassId(in_stack_fffffffffffffba0);
  TPZDohrSubstructCondense<double>::TPZDohrSubstructCondense(in_stack_fffffffffffffbb0);
  iVar3 = TPZDohrSubstructCondense<double>::ClassId(in_stack_fffffffffffffb90);
  TPZDohrSubstructCondense<double>::~TPZDohrSubstructCondense
            ((TPZDohrSubstructCondense<double> *)0x1f81a43);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZDohrPrecond<TVar, TSubStruct>::ClassId() const{
    return Hash("TPZDohrPrecond") ^ TPZMatrix<TVar>::ClassId() << 1 ^ TSubStruct().ClassId() << 2;
}